

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask29_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x1d | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 3;
  *puVar1 = in[2] << 0x1a | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 6;
  *puVar1 = in[3] << 0x17 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] >> 9;
  *puVar1 = in[4] << 0x14 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4] >> 0xc;
  *puVar1 = in[5] << 0x11 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[5] >> 0xf;
  *puVar1 = in[6] << 0xe | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[6] >> 0x12;
  *puVar1 = in[7] << 0xb | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[7] >> 0x15;
  *puVar1 = in[8] << 8 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[8] >> 0x18;
  *puVar1 = in[9] << 5 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[9] >> 0x1b;
  *puVar1 = in[10] << 2 | *puVar1;
  *puVar1 = in[0xb] << 0x1f | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0xb] >> 1;
  *puVar1 = in[0xc] << 0x1c | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0xc] >> 4;
  *puVar1 = in[0xd] << 0x19 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0xd] >> 7;
  *puVar1 = in[0xe] << 0x16 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xe] >> 10;
  *puVar1 = in[0xf] << 0x13 | *puVar1;
  out[0xe] = in[0xf] >> 0xd;
  return out + 0xf;
}

Assistant:

uint32_t *__fastpackwithoutmask29_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (29 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (29 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (29 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (29 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (29 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (29 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (29 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (29 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++out;
  *out = ((*in)) >> (29 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (29 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (29 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (29 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (29 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (29 - 16);
  ++in;

  return out + 1;
}